

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  Message *pMVar1;
  bool bVar2;
  CppType CVar3;
  uint32_t uVar4;
  MessageLite *pMVar5;
  uint32_t *puVar6;
  OneofDescriptor *oneof_descriptor;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  this_00 = &this->schema_;
  if (((byte)field[1] & 8) == 0) {
    if (((~(byte)field[1] & 0x60) != 0) &&
       (bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field), !bVar2)) {
      ClearBit(this,message,field);
    }
    bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
    if (bVar2) {
      bVar2 = HasOneofField(this,message,field);
      if (!bVar2) {
        return (Message *)0x0;
      }
      if (((byte)field[1] & 0x10) == 0) {
        oneof_descriptor = (OneofDescriptor *)0x0;
      }
      else {
        oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
      }
      puVar6 = MutableOneofCase(this,message,oneof_descriptor);
      *puVar6 = 0;
    }
    uVar4 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    pMVar1 = *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = 0;
    return pMVar1;
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
  pMVar5 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                     ((ExtensionSet *)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field,
                      factory);
  return (Message *)pMVar5;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}